

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall
duckdb::Node::MergeNormalNodes
          (Node *this,ART *art,Node *l_node,Node *r_node,uint8_t *byte,GateStatus status)

{
  bool bVar1;
  unsafe_optional_ptr<Node> other;
  unsafe_optional_ptr<Node> this_00;
  
  other = GetNextChildInternal<duckdb::Node_const>(art,r_node,byte);
  while (other.ptr != (Node *)0x0) {
    this_00 = GetChildInternal<duckdb::Node_const>(art,l_node,*byte);
    if (this_00.ptr == (Node *)0x0) {
      InsertChild(art,l_node,*byte,(Node)((other.ptr)->super_IndexPointer).data);
      ReplaceChild(r_node,art,*byte,(Node)0x0);
    }
    else {
      bVar1 = MergeInternal(this_00.ptr,art,other.ptr,status);
      if (!bVar1) {
        return false;
      }
    }
    if (*byte == 0xff) break;
    *byte = *byte + '\x01';
    other = GetNextChildInternal<duckdb::Node_const>(art,r_node,byte);
  }
  Free(art,r_node);
  return true;
}

Assistant:

bool Node::MergeNormalNodes(ART &art, Node &l_node, Node &r_node, uint8_t &byte, const GateStatus status) {
	// Merge N4, N16, N48, N256 nodes.
	D_ASSERT(l_node.IsNode() && r_node.IsNode());
	D_ASSERT(l_node.GetGateStatus() == r_node.GetGateStatus());

	auto r_child = r_node.GetNextChildMutable(art, byte);
	while (r_child) {
		auto l_child = l_node.GetChildMutable(art, byte);
		if (!l_child) {
			Node::InsertChild(art, l_node, byte, *r_child);
			r_node.ReplaceChild(art, byte);
		} else {
			if (!l_child->MergeInternal(art, *r_child, status)) {
				return false;
			}
		}

		if (byte == NumericLimits<uint8_t>::Maximum()) {
			break;
		}
		byte++;
		r_child = r_node.GetNextChildMutable(art, byte);
	}

	Node::Free(art, r_node);
	return true;
}